

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_buf.c
# Opt level: O1

int uo_buf_printf_append(uo_buf *buf,char *format,...)

{
  char in_AL;
  int iVar1;
  ulong uVar2;
  long *plVar3;
  undefined8 in_RCX;
  int iVar4;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  undefined8 local_108;
  void **local_100;
  undefined1 *local_f8;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  iVar4 = (int)*(undefined8 *)(*buf + -0x10) - (int)*(undefined8 *)(*buf + -8);
  local_100 = &args[0].overflow_arg_area;
  local_108 = 0x3000000010;
  local_f8 = local_e8;
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  iVar1 = vsnprintf((char *)(*buf + *(long *)(*buf + -8)),(long)iVar4,format,&local_108);
  if (iVar4 <= iVar1) {
    uVar2 = *(long *)(*buf + -8) + (long)iVar1 + 0x30;
    uVar2 = uVar2 >> 1 | uVar2;
    uVar2 = uVar2 >> 2 | uVar2;
    uVar2 = uVar2 >> 4 | uVar2;
    uVar2 = uVar2 >> 8 | uVar2;
    uVar2 = uVar2 >> 0x10 | uVar2;
    uVar2 = uVar2 >> 0x20 | uVar2;
    plVar3 = (long *)realloc(*buf + -0x10,uVar2 + 1);
    *plVar3 = uVar2 - 0xf;
    *buf = (uo_buf)(plVar3 + 2);
    local_108 = 0x3000000010;
    local_100 = &args[0].overflow_arg_area;
    local_f8 = local_e8;
    vsprintf((char *)(*buf + *(long *)(*buf + -8)),format,&local_108);
  }
  *(long *)(*buf + -8) = *(long *)(*buf + -8) + (long)iVar1;
  return iVar1;
}

Assistant:

int uo_buf_printf_append(
    uo_buf *buf,
    const char *format,
    ...)
{
    int n = uo_buf_get_len_after_ptr(*buf);

    #ifdef _WIN32
        // vsnprintf not ansi compliant

        va_list args[2];
        va_start(args[0], format);
        va_copy(args[1], args[0]);
        int len = vsnprintf(NULL, 0, format, args[0]);
        va_end(args[0]);

        if (len >= n)
        {
            size_t size = uo_ceil_pow2(uo_buf_get_len_before_ptr(*buf) + len + UO_BUF_GROW_SIZE + 1);
            *buf = uo_buf_realloc(*buf, size - UO_BUF_HEADER_SIZE);
        }

        vsprintf(uo_buf_get_ptr(*buf), format, args[1]);
        va_end(args[1]);

    #else

        va_list args;
        va_start(args, format);
        int len = vsnprintf(uo_buf_get_ptr(*buf), n, format, args);
        va_end(args);

        if (len >= n)
        {
            size_t size = uo_ceil_pow2(uo_buf_get_len_before_ptr(*buf) + len + UO_BUF_GROW_SIZE + 1);
            *buf = uo_buf_realloc(*buf, size - UO_BUF_HEADER_SIZE);
            va_start(args, format);
            vsprintf(uo_buf_get_ptr(*buf), format, args);
            va_end(args);
        }

    #endif

    uo_buf_set_ptr_rel(*buf, len);

    return len;
}